

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void __thiscall ObjectBlockPool<32,_2048>::FinalizePending(ObjectBlockPool<32,_2048> *this)

{
  uint uVar1;
  SmallBlock<32> *marker;
  ulong uVar2;
  char *__function;
  uint uVar3;
  ExternTypeInfo *elementType;
  long lVar4;
  
  uVar1 = (this->objectsToFinalize).count;
  if (uVar1 != 0) {
    lVar4 = 0;
    do {
      if ((this->objectsToFinalize).count <= (uint)lVar4) {
        __function = 
        "T &FastVector<SmallBlock<32> *>::operator[](unsigned int) [T = SmallBlock<32> *, zeroNewMemory = false, skipConstructor = false]"
        ;
LAB_00121acf:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,__function);
      }
      marker = (this->objectsToFinalize).data[lVar4];
      uVar2 = marker->marker;
      marker->marker = uVar2 | 1;
      uVar3 = (uint)(uVar2 >> 8) & 0xffffff;
      if (*(uint *)(NULLC::linker + 0x20c) <= uVar3) {
        __function = 
        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_00121acf;
      }
      elementType = (ExternTypeInfo *)((ulong)(uVar3 * 0x50) + *(long *)(NULLC::linker + 0x200));
      if ((uVar2 & 0x10) == 0) {
        GC::CheckVariable((char *)(&marker->marker + 1),elementType);
      }
      else {
        uVar3._0_1_ = elementType->defaultAlign;
        uVar3._1_1_ = elementType->typeFlags;
        uVar3._2_2_ = elementType->pointerCount;
        if ((byte)(undefined1)uVar3 < 5) {
          uVar3 = 4;
        }
        GC::CheckArrayElements
                  (marker->data + (ulong)(uVar3 & 0xff) + 8,
                   *(uint *)((long)marker + (ulong)(uVar3 & 0xff) + 4),elementType);
      }
      NULLC::FinalizeObject(&marker->marker,(char *)marker);
      lVar4 = lVar4 + 1;
    } while (uVar1 != (uint)lVar4);
  }
  (this->objectsToFinalize).count = 0;
  return;
}

Assistant:

void FinalizePending()
	{
		for(unsigned i = 0, e = objectsToFinalize.size(); i < e; i++)
		{
			MySmallBlock *block = objectsToFinalize[i];

			markerType &marker = block->marker;

			// Mark block as used
			marker |= NULLC::OBJECT_VISIBLE;

			ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

			char *base = block->data;

			if(marker & NULLC::OBJECT_ARRAY)
			{
				unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

				unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);

				GC::CheckArrayElements(base + sizeof(markerType) + arrayPadding, count, typeInfo);
			}
			else
			{
				GC::CheckVariable(base + sizeof(markerType), typeInfo);
			}

			NULLC::FinalizeObject(marker, block->data);
		}

		objectsToFinalize.clear();
	}